

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O1

void txvalidationcache_tests::ValidateCheckInputsForAllFlags
               (CTransaction *tx,uint32_t failing_flags,bool add_to_cache,
               CCoinsViewCache *active_coins_tip,ValidationCache *validation_cache)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *this;
  iterator pvVar6;
  iterator pvVar7;
  int iVar8;
  uint uVar9;
  uint uVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar12;
  undefined1 local_578 [8];
  long local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks_1;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  bool expected_return_value;
  bool ret;
  undefined1 local_450 [8];
  assertion_result local_448;
  assertion_result *local_430;
  bool *local_428;
  element_type *local_420;
  shared_count local_418;
  assertion_result local_410;
  undefined1 local_3f8 [24];
  assertion_result *local_3e0;
  PoolResource<144UL,_8UL> local_3c0;
  CoinsCachePair *local_2d0;
  CoinsCachePair *local_2c8;
  uint8_t local_2c0;
  direct_or_indirect local_2b0;
  uint local_294;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_288;
  TxValidationState state;
  FastRandomContext insecure_rand;
  PrecomputedTransactionData txdata;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&txdata,0,0x102);
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  txdata._281_8_ = 0;
  FastRandomContext::FastRandomContext(&insecure_rand,true);
  iVar8 = 0;
  do {
    paVar10 = &state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)paVar10;
    do {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)RandomMixin<FastRandomContext>::randbits
                            (&insecure_rand.super_RandomMixin<FastRandomContext>,0x15);
      paVar2 = paVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x1fffff >= paVar4) {
        paVar2 = paVar4;
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)paVar2 & 0xffffffff);
      uVar9 = (uint)paVar2;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1fffff < paVar4);
    uVar11 = uVar9 | 0x801;
    if ((uVar9 >> 8 & 1) == 0) {
      uVar11 = uVar9;
    }
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
    uVar11 = uVar11 >> 0xb & 1 | uVar11;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)(ulong)add_to_cache;
    bVar3 = CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar11,true,add_to_cache,
                              &txdata,validation_cache,
                              (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    local_3f8._0_8_ = &PTR_GetCoin_013bb490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_288);
    if (local_2c0 != '\0') {
      (local_2c8->second).m_prev = local_2d0;
      (local_2d0->second).m_next = local_2c8;
      local_2c0 = '\0';
    }
    if (0x1c < local_294) {
      free(local_2b0.indirect_contents.indirect);
      local_2b0.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource(&local_3c0);
    expected_return_value = (failing_flags & uVar11) == 0;
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_460 = "";
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x95;
    file.m_begin = (iterator)&local_468;
    msg.m_end = pvVar7;
    msg.m_begin = pvVar6;
    ret = bVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_478,msg);
    scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)scriptchecks_1.
                          super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abb30;
    scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_410.m_message.px = (element_type *)0x0;
    local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b8e46e;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf6a382;
    local_420 = (element_type *)&ret;
    local_3f8[8] = 0;
    local_3f8._0_8_ = &PTR__lazy_ostream_013abe90;
    local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3e0 = (assertion_result *)&local_420;
    local_428 = &expected_return_value;
    local_448.m_message.px = (element_type *)((ulong)local_448.m_message.px & 0xffffffffffffff00);
    local_448._0_8_ = &PTR__lazy_ostream_013abe90;
    local_448.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_430 = (assertion_result *)&local_428;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(ret == expected_return_value);
    boost::test_tools::tt_detail::report_assertion
              (&local_410,(lazy_ostream *)&scriptchecks_1,1,2,REQUIRE,0xf3e857,(size_t)&scriptchecks
               ,0x95,local_3f8,"expected_return_value",&local_448);
    boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
    if ((ret & add_to_cache) == 1) {
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_4a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4a0 = "";
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x9b;
      file_00.m_begin = (iterator)&local_4a8;
      msg_00.m_end = pvVar7;
      msg_00.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4b8,
                 msg_00);
      _cVar12 = 0x6d0e03;
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
      local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar11,true,true,&txdata,
                             validation_cache,&scriptchecks_1);
      local_410.m_message.px = (element_type *)0x0;
      local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b948a0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xf6abf1;
      local_448.m_message.px = (element_type *)((ulong)local_448.m_message.px & 0xffffffffffffff00);
      local_448._0_8_ = &PTR__lazy_ostream_013abc70;
      local_448.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_430 = (assertion_result *)&scriptchecks;
      local_4c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4c0 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_410,(lazy_ostream *)&local_448,1,0,WARN,_cVar12,(size_t)&local_4c8,0x9b);
      boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
      local_3f8._0_8_ = &PTR_GetCoin_013bb490;
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_288);
      if (local_2c0 != '\0') {
        (local_2c8->second).m_prev = local_2d0;
        (local_2d0->second).m_next = local_2c8;
        local_2c0 = '\0';
      }
      if (0x1c < local_294) {
        free(local_2b0.indirect_contents.indirect);
        local_2b0.indirect_contents.indirect = (char *)0x0;
      }
      PoolResource<144UL,_8UL>::~PoolResource(&local_3c0);
      local_4d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4d0 = "";
      local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar12 = 0x6d0fd8;
      file_01.m_end = (iterator)0x9c;
      file_01.m_begin = (iterator)&local_4d8;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4e8,
                 msg_01);
      local_448.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           (scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_start ==
           scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_finish);
      local_448.m_message.px = (element_type *)0x0;
      local_448.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_410._0_8_ = "scriptchecks.empty()";
      local_410.m_message.px = (element_type *)0xf6ac06;
      local_3f8[8] = 0;
      local_3f8._0_8_ = &PTR__lazy_ostream_013abc70;
      local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3e0 = &local_410;
      local_4f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4f0 = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_448,(lazy_ostream *)local_3f8,1,0,WARN,_cVar12,(size_t)&local_4f8,0x9c);
      boost::detail::shared_count::~shared_count(&local_448.m_message.pn);
      this = &scriptchecks_1;
    }
    else {
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_528 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_520 = "";
      local_538 = &boost::unit_test::basic_cstring<char_const>::null;
      local_530 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xa1;
      file_02.m_begin = (iterator)&local_528;
      msg_02.m_end = pvVar7;
      msg_02.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_538,
                 msg_02);
      _cVar12 = 0x6d1128;
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
      bVar3 = CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar11,true,add_to_cache,
                                &txdata,validation_cache,&scriptchecks);
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(scriptchecks_1.
                             super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,bVar3);
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_410._0_8_ =
           "CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks)"
      ;
      local_410.m_message.px = (element_type *)0xf6abf1;
      local_448.m_message.px = (element_type *)((ulong)local_448.m_message.px & 0xffffffffffffff00);
      local_448._0_8_ = &PTR__lazy_ostream_013abc70;
      local_448.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_430 = &local_410;
      local_548 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_540 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&scriptchecks_1,(lazy_ostream *)&local_448,1,0,WARN,_cVar12,
                 (size_t)&local_548,0xa1);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_3f8._0_8_ = &PTR_GetCoin_013bb490;
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_288);
      if (local_2c0 != '\0') {
        (local_2c8->second).m_prev = local_2d0;
        (local_2d0->second).m_next = local_2c8;
        local_2c0 = '\0';
      }
      if (0x1c < local_294) {
        free(local_2b0.indirect_contents.indirect);
        local_2b0.indirect_contents.indirect = (char *)0x0;
      }
      PoolResource<144UL,_8UL>::~PoolResource(&local_3c0);
      local_558 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_550 = "";
      local_568 = &boost::unit_test::basic_cstring<char_const>::null;
      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xa2;
      file_03.m_begin = (iterator)&local_558;
      msg_03.m_end = pvVar7;
      msg_03.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_568,
                 msg_03);
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((ulong)scriptchecks_1.
                            super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                            super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abb30;
      scriptchecks_1.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_570 = ((long)scriptchecks.
                         super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)scriptchecks.
                         super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
      lVar5 = (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      local_578 = (undefined1  [8])(lVar5 * 0x4ec4ec4ec4ec4ec5);
      local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)(local_570 + lVar5 * -0x4ec4ec4ec4ec4ec5 == 0);
      local_410.m_message.px = (element_type *)0x0;
      local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_420 = (element_type *)0xf6a312;
      local_418.pi_ = (sp_counted_base *)0xf6a382;
      local_428 = (bool *)&local_570;
      local_3f8[8] = 0;
      local_3f8._0_8_ = &PTR__lazy_ostream_013abb70;
      local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3e0 = (assertion_result *)&local_428;
      local_450 = (undefined1  [8])local_578;
      local_448.m_message.px = (element_type *)((ulong)local_448.m_message.px & 0xffffffffffffff00);
      local_448._0_8_ = &PTR__lazy_ostream_013abb70;
      local_448.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_430 = (assertion_result *)local_450;
      boost::test_tools::tt_detail::report_assertion
                (&local_410,(lazy_ostream *)&scriptchecks_1,1,2,REQUIRE,0xf6a67f,(size_t)&local_420,
                 0xa2,(CCoinsViewCache *)local_3f8,"tx.vin.size()",&local_448);
      boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
      this = &scriptchecks;
    }
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                      _M_p,CONCAT71(state.super_ValidationState<TxValidationResult>.m_debug_message.
                                    field_2._M_allocated_capacity._1_7_,
                                    state.super_ValidationState<TxValidationResult>.m_debug_message.
                                    field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p !=
        &state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
      operator_delete(state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                      _M_p,CONCAT71(state.super_ValidationState<TxValidationResult>.m_reject_reason.
                                    field_2._M_allocated_capacity._1_7_,
                                    state.super_ValidationState<TxValidationResult>.m_reject_reason.
                                    field_2._M_local_buf[0]) + 1);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 10000);
  ChaCha20::~ChaCha20(&insecure_rand.rng);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    PrecomputedTransactionData txdata;

    FastRandomContext insecure_rand(true);

    for (int count = 0; count < 10000; ++count) {
        TxValidationState state;

        // Randomly selects flag combinations
        uint32_t test_flags = (uint32_t) insecure_rand.randrange((SCRIPT_VERIFY_END_MARKER - 1) << 1);

        // Filter out incompatible flag choices
        if ((test_flags & SCRIPT_VERIFY_CLEANSTACK)) {
            // CLEANSTACK requires P2SH and WITNESS, see VerifyScript() in
            // script/interpreter.cpp
            test_flags |= SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS;
        }
        if ((test_flags & SCRIPT_VERIFY_WITNESS)) {
            // WITNESS requires P2SH
            test_flags |= SCRIPT_VERIFY_P2SH;
        }
        bool ret = CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, nullptr);
        // CheckInputScripts should succeed iff test_flags doesn't intersect with
        // failing_flags
        bool expected_return_value = !(test_flags & failing_flags);
        BOOST_CHECK_EQUAL(ret, expected_return_value);

        // Test the caching
        if (ret && add_to_cache) {
            // Check that we get a cache hit if the tx was valid
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK(scriptchecks.empty());
        } else {
            // Check that we get script executions to check, if the transaction
            // was invalid, or we didn't add to cache.
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK_EQUAL(scriptchecks.size(), tx.vin.size());
        }
    }
}